

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deblock.c
# Opt level: O1

void deblock_edge_chro_hor
               (pel *src,int stride,int alpha_u,int beta_u,int alpha_v,int beta_v,int edge_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  pel *ppVar17;
  int iVar18;
  pel *ppVar19;
  uint uVar20;
  long lVar21;
  bool bVar22;
  pel *local_78;
  pel *local_70;
  pel *local_68;
  uint local_60 [2];
  pel *local_58;
  ulong local_50;
  int local_48 [2];
  ulong local_40;
  ulong local_38;
  int beta [2];
  int alpha [2];
  
  local_48[0] = alpha_u;
  local_48[1] = alpha_v;
  local_60[0] = beta_u;
  local_60[1] = beta_v;
  uVar14 = (uint)((~edge_flag & 0x202U) == 0) * 2 + 2;
  local_38 = (ulong)uVar14;
  uVar12 = (ulong)(~edge_flag * 2 & 4);
  local_68 = src + uVar12;
  local_58 = src + uVar12 + (long)(stride * -3);
  local_78 = src + (uVar12 - (long)(stride * 2));
  ppVar17 = src + (uVar12 - (long)stride);
  local_70 = src + uVar12 + (long)stride;
  ppVar19 = src + uVar12 + (long)(stride * 2);
  lVar13 = 0;
  do {
    uVar5 = local_60[lVar13];
    lVar21 = 0;
    do {
      uVar16 = (uint)local_78[lVar21 * 2];
      bVar1 = ppVar17[lVar21 * 2];
      uVar20 = (uint)local_68[lVar21 * 2];
      bVar2 = local_70[lVar21 * 2];
      uVar9 = uVar20 - bVar1;
      uVar7 = -uVar9;
      if (0 < (int)uVar9) {
        uVar7 = uVar9;
      }
      uVar10 = uVar16 - bVar1;
      uVar9 = -uVar10;
      if (0 < (int)uVar10) {
        uVar9 = uVar10;
      }
      uVar11 = (uint)local_68[lVar21 * 2] - (uint)bVar2;
      uVar10 = -uVar11;
      if (0 < (int)uVar11) {
        uVar10 = uVar11;
      }
      if (((int)(uVar9 & 0xff) < (int)uVar5) && ((int)(uVar10 & 0xff) < (int)uVar5)) {
        bVar3 = local_58[lVar21 * 2];
        bVar4 = ppVar19[lVar21 * 2];
        local_50 = (ulong)bVar4;
        uVar11 = uVar20 * 3;
        local_40 = (ulong)uVar11;
        ppVar17[lVar21 * 2] =
             (pel)(uVar16 * 3 + uVar11 + ((uint)bVar1 + (uint)bVar1 * 4) * 2 + 8 >> 4);
        iVar18 = (uint)bVar1 + (uint)bVar1 * 2;
        local_68[lVar21 * 2] = (pel)((uint)bVar2 + (uint)bVar2 * 2 + iVar18 + uVar20 * 10 + 8 >> 4);
        iVar15 = (uint)bVar3 - (uint)bVar1;
        iVar8 = -iVar15;
        if (0 < iVar15) {
          iVar8 = iVar15;
        }
        uVar6 = local_60[lVar13];
        if (iVar8 < (int)uVar6) {
          iVar15 = bVar4 - uVar20;
          iVar8 = -iVar15;
          if (0 < iVar15) {
            iVar8 = iVar15;
          }
          if ((((iVar8 < (int)uVar6) && ((uVar10 & 0xff) <= uVar6 >> 2)) &&
              ((uVar9 & 0xff) <= uVar6 >> 2)) && ((int)(uVar7 & 0xff) < local_48[lVar13])) {
            local_78[lVar21 * 2] =
                 (pel)((uint)bVar3 * 3 + uVar16 * 8 + iVar18 + uVar20 * 2 + 8 >> 4);
            local_70[lVar21 * 2] =
                 (pel)(uVar11 + (uint)bVar1 * 2 + (uint)bVar2 * 8 + (uint)bVar4 * 3 + 8 >> 4);
          }
        }
      }
      lVar21 = lVar21 + 1;
    } while (uVar14 != (uint)lVar21);
    local_58 = local_58 + 1;
    local_78 = local_78 + 1;
    ppVar17 = ppVar17 + 1;
    local_70 = local_70 + 1;
    ppVar19 = ppVar19 + 1;
    local_68 = local_68 + 1;
    bVar22 = lVar13 == 0;
    lVar13 = lVar13 + 1;
  } while (bVar22);
  return;
}

Assistant:

void deblock_edge_chro_hor(pel *src, int stride, int alpha_u, int beta_u, int alpha_v, int beta_v, int edge_flag)
{
    int i, line_size = 4;
    int inc = stride;
    int inc2 = inc << 1;
    int inc3 = inc + inc2;
    int alpha[2] = { alpha_u, alpha_v };
    int beta[2] = { beta_u, beta_v };
    pel *p_src;
    int uv;

    if ((edge_flag & 0x0202) != 0x0202) {
        line_size = 2;
    }
    if (!(edge_flag & 0x2)) {
        src += 4;
    }

    for (uv = 0; uv < 2; uv++) {
        p_src = src + uv;
        for (i = 0; i < line_size; i++, p_src += 2) {
            int L2 = p_src[-inc3];
            int L1 = p_src[-inc2];
            int L0 = p_src[-inc];
            int R0 = p_src[0];
            int R1 = p_src[inc];
            int R2 = p_src[inc2];
            int delta_m = COM_ABS(R0 - L0);
            int delta_l = COM_ABS(L1 - L0);
            int delta_r = COM_ABS(R0 - R1);

            if ((delta_l < beta[uv]) && (delta_r < beta[uv])) {
                p_src[-inc] = (pel)((L1 * 3 + L0 * 10 + R0 * 3 + 8) >> 4);                  // L0
                p_src[0] = (pel)((R1 * 3 + R0 * 10 + L0 * 3 + 8) >> 4);                     // R0
                if ((COM_ABS(L2 - L0) < beta[uv]) && (COM_ABS(R2 - R0) < beta[uv]) && 
                    delta_r <= beta[uv] / 4 && delta_l <= beta[uv] / 4 && delta_m < alpha[uv]) {
                    p_src[-inc2] = (pel)((L2 * 3 + L1 * 8 + L0 * 3 + R0 * 2 + 8) >> 4);     // L1
                    p_src[inc] = (pel)((R2 * 3 + R1 * 8 + R0 * 3 + L0 * 2 + 8) >> 4);       // R1
                }
            }
        }
    }
}